

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_api.c
# Opt level: O0

WORD32 ihevcd_create(iv_obj_t *ps_codec_obj,void *pv_api_ip,void *pv_api_op)

{
  WORD32 WVar1;
  codec_t *in_RDX;
  long in_RDI;
  codec_t *ps_codec;
  WORD32 ret;
  ihevcd_cxa_create_op_t *ps_create_op;
  ihevcd_cxa_create_op_t *in_stack_00000038;
  ihevcd_cxa_create_ip_t *in_stack_00000040;
  iv_obj_t **in_stack_00000048;
  codec_t *ps_codec_00;
  WORD32 local_4;
  
  in_RDX->i4_ht = 0;
  ps_codec_00 = in_RDX;
  WVar1 = ihevcd_allocate_static_bufs(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  if ((WVar1 == 1) && (in_RDI != 0)) {
    ihevcd_free_static_bufs((iv_obj_t *)ps_codec_00);
    in_RDX->i4_ht = 0x2b;
    in_RDX->i4_ht = 0x4000;
    local_4 = 1;
  }
  else {
    local_4 = ihevcd_init(ps_codec_00);
  }
  return local_4;
}

Assistant:

WORD32 ihevcd_create(iv_obj_t *ps_codec_obj,
                           void *pv_api_ip,
                           void *pv_api_op)
{

    ihevcd_cxa_create_op_t *ps_create_op;

    WORD32 ret;
    codec_t *ps_codec;
    ps_create_op = (ihevcd_cxa_create_op_t *)pv_api_op;

    ps_create_op->s_ivd_create_op_t.u4_error_code = 0;

    ret = ihevcd_allocate_static_bufs(&ps_codec_obj, pv_api_ip, pv_api_op);

    /* If allocation of some buffer fails, then free buffers allocated till then */
    if((IV_FAIL == ret) && (NULL != ps_codec_obj))
    {
        ihevcd_free_static_bufs(ps_codec_obj);
        ps_create_op->s_ivd_create_op_t.u4_error_code = IVD_MEM_ALLOC_FAILED;
        ps_create_op->s_ivd_create_op_t.u4_error_code = 1 << IVD_FATALERROR;

        return IV_FAIL;
    }
    ps_codec = (codec_t *)ps_codec_obj->pv_codec_handle;
    ret = ihevcd_init(ps_codec);

    TRACE_INIT(NULL);
    STATS_INIT();

    return ret;
}